

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler3>>::
ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler3>>::AlgebraicConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler3>>
           *this)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  TextReader<fmt::Locale> *this_00;
  int iVar4;
  bool bVar5;
  int var_index;
  undefined8 local_38;
  
  local_38 = in_RAX;
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  iVar4 = 0;
  if (0 < *(int *)(*(long *)(this + 8) + 4)) {
    iVar4 = *(int *)(*(long *)(this + 8) + 4);
  }
  do {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) {
      return;
    }
    this_00 = *(TextReader<fmt::Locale> **)this;
    pcVar1 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar1;
    (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
    switch(*pcVar1) {
    case '0':
      TextReader<fmt::Locale>::ReadDouble(this_00);
      this_00 = *(TextReader<fmt::Locale> **)this;
    case '1':
    case '2':
    case '4':
      TextReader<fmt::Locale>::ReadDouble(this_00);
      break;
    case '3':
      break;
    case '5':
      uVar2 = TextReader<fmt::Locale>::ReadInt<int>(this_00);
      iVar3 = TextReader<fmt::Locale>::ReadUInt<int>(*(TextReader<fmt::Locale> **)this);
      local_38._0_4_ = iVar3;
      if ((iVar3 == 0) || (**(int **)(this + 8) < iVar3)) {
        TextReader<fmt::Locale>::ReportError<int>
                  (*(TextReader<fmt::Locale> **)this,(CStringRef)0x21c08e,(int *)&local_38);
      }
      local_38 = CONCAT44(local_38._4_4_,(int)local_38 + -1);
      ComplInfo::ComplInfo((ComplInfo *)((long)&local_38 + 4),uVar2 & 3);
      break;
    default:
      TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x215656);
    }
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}